

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

bool __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,bool b)

{
  bool bVar1;
  byte in_SIL;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_RDI;
  bool in_stack_00000037;
  MADPComponentDiscreteObservations *in_stack_00000038;
  undefined1 uVar3;
  MultiAgentDecisionProcessDiscreteFactoredStates *pMVar2;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if ((in_SIL & 1) == 1) {
    pMVar2 = in_RDI;
    bVar1 = MADPComponentDiscreteActions::SetInitialized((MADPComponentDiscreteActions *)this,b);
    uVar3 = (undefined1)((ulong)pMVar2 >> 0x38);
    if (((bVar1) &&
        (bVar1 = MADPComponentDiscreteObservations::SetInitialized
                           (in_stack_00000038,in_stack_00000037), bVar1)) &&
       (bVar1 = MADPComponentFactoredStates::SetInitialized
                          ((MADPComponentFactoredStates *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(bool)uVar3
                          ), bVar1)) {
      bVar1 = SanityCheck(in_RDI);
      if (bVar1) {
        in_RDI->_m_initialized = true;
        bVar1 = true;
      }
      else {
        in_RDI->_m_initialized = false;
        bVar1 = false;
      }
    }
    else {
      in_RDI->_m_initialized = false;
      bVar1 = false;
    }
  }
  else {
    pMVar2 = in_RDI;
    MADPComponentDiscreteActions::SetInitialized((MADPComponentDiscreteActions *)this,b);
    uVar3 = (undefined1)((ulong)pMVar2 >> 0x38);
    MADPComponentDiscreteObservations::SetInitialized(in_stack_00000038,in_stack_00000037);
    MADPComponentFactoredStates::SetInitialized
              ((MADPComponentFactoredStates *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(bool)uVar3);
    in_RDI->_m_initialized = false;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized(bool b)
{

    if(b == true)
    {
        if(     !_m_A.SetInitialized(b)
            ||  !_m_O.SetInitialized(b)
            ||  !_m_S.SetInitialized(b) )
        {
            //error in initialization of sub-components.
            _m_initialized = false;
            return(false);
        }
        ////check if transition- and observation model are present...
        //if(_m_p_tModel == 0)
        //{
            //throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no transition model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");
        //}
        //if(_m_p_oModel == 0)
        //{
            //throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no observation model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");

        //}

        if( SanityCheck() )
        {
            _m_initialized = true;
            return(true);
        }
        else
        {
            _m_initialized = false;
            return(false);
        }
    }
    else
    {
        _m_A.SetInitialized(b);
        _m_O.SetInitialized(b);
        _m_S.SetInitialized(b); 
        _m_initialized = false;
        return(true);
    }

}